

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

bool __thiscall duckdb_shell::ShellState::ImportData(ShellState *this,char **azArg,idx_t nArg)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  uint idx;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  char *pcVar12;
  FILE *pFVar13;
  code *pcVar14;
  ShellState *pSVar15;
  char *pcVar16;
  char *pcVar17;
  size_t sStack_d0;
  sqlite3_stmt *pStmt;
  char *local_c0;
  int local_b4;
  ShellState *local_b0;
  char *local_a8;
  size_t local_a0;
  ImportCtx local_98;
  ulong local_48;
  char zSep [2];
  ulong local_38;
  
  if (safe_mode == '\x01') {
    pcVar12 = ".import cannot be used in -safe mode\n";
    sStack_d0 = 0x25;
    goto LAB_001e493f;
  }
  pStmt = (sqlite3_stmt *)0x0;
  local_98.nErr = 0;
  local_98.bNotFirst = 0;
  local_98.cTerm = 0;
  local_98.cColSep = 0;
  local_98.n = 0;
  local_98.nAlloc = 0;
  local_98.nLine = 0;
  local_98.nRow = 0;
  local_98.xCloser = (_func_int_FILE_ptr *)0x0;
  local_98.z = (char *)0x0;
  local_98.cRowSep = 0;
  local_98._68_4_ = 0;
  local_98.zFile = (char *)0x0;
  local_98.in = (FILE *)0x0;
  pcVar14 = csv_read_one_field;
  if (this->mode == ASCII) {
    pcVar14 = ascii_read_one_field;
  }
  local_a0 = nArg - 1;
  local_a8 = (char *)CONCAT44(local_a8._4_4_,1);
  local_48 = 0;
  local_c0 = (char *)0x0;
  local_b4 = 0;
  local_38 = 0;
  pcVar12 = (char *)0x0;
  local_b0 = this;
  for (uVar8 = 1; pSVar15 = local_b0, uVar8 < nArg; uVar8 = uVar8 + 1) {
    pcVar16 = azArg[uVar8];
    pcVar17 = pcVar12;
    pcVar1 = local_c0;
    if (*pcVar16 == '-') {
      if (pcVar16[1] == '-') {
        pcVar16 = pcVar16 + 1;
      }
      if ((pcVar16[1] == 'v') && (pcVar16[2] == '\0')) {
        local_b4 = local_b4 + 1;
      }
      else {
        iVar3 = strcmp(pcVar16,"-skip");
        if ((uVar8 < local_a0) && (iVar3 == 0)) {
          lVar6 = uVar8 + 1;
          uVar8 = uVar8 + 1;
          local_38 = integerValue(azArg[lVar6]);
          pcVar1 = local_c0;
        }
        else {
          iVar3 = strcmp(pcVar16,"-ascii");
          if (iVar3 == 0) {
            local_98.cColSep = 0x1f;
            local_98.cRowSep = 0x1e;
            local_a8 = (char *)((ulong)local_a8 & 0xffffffff00000000);
            local_48 = 0x1f;
            pcVar14 = ascii_read_one_field;
            pcVar1 = local_c0;
          }
          else {
            iVar3 = strcmp(pcVar16,"-csv");
            if (iVar3 != 0) {
              pFVar13 = (FILE *)local_b0->out;
              pcVar12 = "ERROR: unknown option: \"%s\".  Usage:\n";
              goto LAB_001e4591;
            }
            local_98.cColSep = 0x2c;
            local_98.cRowSep = 10;
            local_a8 = (char *)((ulong)local_a8 & 0xffffffff00000000);
            local_48 = 0x2c;
            pcVar14 = csv_read_one_field;
            pcVar1 = local_c0;
          }
        }
      }
    }
    else {
      pcVar17 = pcVar16;
      if ((pcVar12 != (char *)0x0) && (pcVar17 = pcVar12, pcVar1 = pcVar16, local_c0 != (char *)0x0)
         ) {
        pFVar13 = (FILE *)local_b0->out;
        pcVar12 = "ERROR: extra argument: \"%s\".  Usage:\n";
        goto LAB_001e4591;
      }
    }
    local_c0 = pcVar1;
    pcVar12 = pcVar17;
  }
  if (local_c0 == (char *)0x0) {
    pFVar13 = (FILE *)local_b0->out;
    pcVar16 = "FILE TABLE";
    if (pcVar12 == (char *)0x0) {
      pcVar16 = "?DB? FILE";
    }
    pcVar16 = pcVar16 + 5;
    pcVar12 = "ERROR: missing %s argument. Usage:\n";
LAB_001e4591:
    pSVar15 = local_b0;
    fprintf(pFVar13,pcVar12,pcVar16);
    showHelp(pSVar15->out,"import");
    return false;
  }
  seenInterrupt = 0;
  OpenDB(local_b0,0);
  iVar3 = (int)local_a8;
  if ((int)local_a8 != 0) {
    iVar4 = (int)(pSVar15->colSeparator)._M_string_length;
    if (iVar4 == 0) {
      pcVar12 = "Error: non-null column separator required for import\n";
      sStack_d0 = 0x35;
      goto LAB_001e493f;
    }
    if (1 < iVar4) {
      pcVar12 = "Error: multi-character column separators not allowed for import\n";
      sStack_d0 = 0x40;
      goto LAB_001e493f;
    }
    iVar4 = (int)(pSVar15->rowSeparator)._M_string_length;
    if (iVar4 == 2) {
      if (pSVar15->mode == CSV) {
        bVar2 = std::operator==(&pSVar15->rowSeparator,"\r\n");
        if (bVar2) {
          std::__cxx11::string::assign((char *)&pSVar15->rowSeparator);
          iVar4 = (int)(pSVar15->rowSeparator)._M_string_length;
          goto LAB_001e42b6;
        }
      }
    }
    else {
      if (iVar4 == 0) {
        pcVar12 = "Error: non-null row separator required for import\n";
        sStack_d0 = 0x32;
        goto LAB_001e493f;
      }
LAB_001e42b6:
      if (iVar4 < 2) {
        local_98.cColSep = (int)*(pSVar15->colSeparator)._M_dataplus._M_p;
        local_48 = (ulong)(uint)local_98.cColSep;
        local_98.cRowSep = (int)*(pSVar15->rowSeparator)._M_dataplus._M_p;
        goto LAB_001e42e0;
      }
    }
    pcVar12 = "Error: multi-character row separators not allowed for import\n";
    sStack_d0 = 0x3d;
LAB_001e493f:
    fwrite(pcVar12,sStack_d0,1,_stderr);
    return false;
  }
LAB_001e42e0:
  local_98.nLine = 1;
  local_98.zFile = pcVar12;
  if (*pcVar12 == '|') {
    local_98.in = (FILE *)popen(pcVar12 + 1,"r");
    local_98.zFile = "<pipe>";
    local_98.xCloser = pclose;
  }
  else {
    local_98.in = (FILE *)fopen64(pcVar12,"rb");
    local_98.xCloser = fclose;
  }
  if ((FILE *)local_98.in == (FILE *)0x0) {
    pcVar16 = "Error: cannot open \"%s\"\n";
LAB_001e490e:
    fprintf(_stderr,pcVar16,pcVar12);
    return false;
  }
  if ((1 < local_b4) || (local_b4 == 1 && iVar3 != 0)) {
    zSep[1] = '\0';
    zSep[0] = (char)local_48;
    fwrite("Column separator ",0x11,1,(FILE *)pSVar15->out);
    OutputCString(pSVar15,zSep);
    fwrite(", row separator ",0x10,1,(FILE *)pSVar15->out);
    zSep[0] = (char)local_98.cRowSep;
    OutputCString(pSVar15,zSep);
    fputc(10,(FILE *)pSVar15->out);
  }
LAB_001e43d0:
  if (0 < (int)local_38) {
    local_38 = (ulong)((int)local_38 - 1);
    do {
      lVar6 = (*pcVar14)(&local_98);
      if (lVar6 == 0) break;
    } while (local_98.cTerm == local_98.cColSep);
    goto LAB_001e43d0;
  }
  pcVar12 = duckdb_shell_sqlite3_mprintf("SELECT * FROM %s",local_c0);
  if (pcVar12 == (char *)0x0) goto LAB_001e49c8;
  sVar7 = strlen(pcVar12);
  iVar3 = duckdb_shell_sqlite3_prepare_v2(pSVar15->db,pcVar12,-1,&pStmt,(char **)0x0);
  import_append_char(&local_98,0);
  if (iVar3 == 0) {
    duckdb_shell_sqlite3_free(pcVar12);
LAB_001e4475:
    uVar5 = duckdb_shell_sqlite3_column_count(pStmt);
    duckdb_shell_sqlite3_finalize(pStmt);
    pStmt = (sqlite3_stmt *)0x0;
    if (uVar5 == 0) {
      return false;
    }
    pcVar12 = (char *)duckdb_shell_sqlite3_malloc64((long)(int)((uVar5 + (int)sVar7) * 2 + 0x14));
    if (pcVar12 == (char *)0x0) {
LAB_001e49c8:
      import_cleanup(&local_98);
      shell_out_of_memory();
    }
    duckdb_shell_sqlite3_snprintf((int)sVar7 + 0x14,pcVar12,"INSERT INTO \"%w\" VALUES(?",local_c0);
    sVar7 = strlen(pcVar12);
    lVar6 = sVar7 << 0x20;
    for (lVar9 = 0; (int)lVar9 + 1 < (int)uVar5; lVar9 = lVar9 + 1) {
      (pcVar12 + lVar9 * 2 + (long)(int)sVar7)[0] = ',';
      (pcVar12 + lVar9 * 2 + (long)(int)sVar7)[1] = '?';
      lVar6 = lVar6 + 0x200000000;
    }
    (pcVar12 + (lVar6 >> 0x20))[0] = ')';
    (pcVar12 + (lVar6 >> 0x20))[1] = '\0';
    if (1 < local_b4) {
      fprintf((FILE *)pSVar15->out,"Insert using: %s\n",pcVar12);
    }
    iVar3 = duckdb_shell_sqlite3_prepare_v2(pSVar15->db,pcVar12,-1,&pStmt,(char **)0x0);
    duckdb_shell_sqlite3_free(pcVar12);
    if (iVar3 == 0) {
      iVar3 = duckdb_shell_sqlite3_get_autocommit(pSVar15->db);
      local_a0 = CONCAT44(local_a0._4_4_,iVar3);
      if (iVar3 != 0) {
        duckdb_shell_sqlite3_exec
                  (pSVar15->db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      }
      do {
        local_c0 = (char *)CONCAT44(local_c0._4_4_,local_98.nLine);
        idx = 0;
        while ((uVar11 = idx, (int)uVar11 < (int)uVar5 &&
               ((pcVar12 = (char *)(*pcVar14)(&local_98), uVar11 != 0 || (pcVar12 != (char *)0x0))))
              ) {
          if (local_b0->mode == ASCII) {
            if (pcVar12 == (char *)0x0) {
              if (uVar11 == 0) break;
            }
            else if ((uVar11 == 0) && (*pcVar12 == '\0')) break;
          }
          idx = uVar11 + 1;
          duckdb_shell_sqlite3_bind_text
                    (pStmt,idx,pcVar12,-1,(_func_void_void_ptr *)0xffffffffffffffff);
          if (((int)uVar11 < (int)(uVar5 - 1)) && (local_98.cTerm != local_98.cColSep)) {
            fprintf(_stderr,"%s:%d: expected %d columns but found %d - filling the rest with NULL\n"
                    ,local_98.zFile,(ulong)local_c0 & 0xffffffff,(ulong)uVar5,(ulong)idx);
            for (idx = uVar11 + 3; (int)(idx - 1) <= (int)uVar5; idx = idx + 1) {
              duckdb_shell_sqlite3_bind_null(pStmt,idx - 1);
            }
          }
        }
        if (local_98.cTerm == local_98.cColSep) {
          do {
            (*pcVar14)(&local_98);
            uVar11 = uVar11 + 1;
          } while (local_98.cTerm == local_98.cColSep);
          fprintf(_stderr,"%s:%d: expected %d columns but found %d - extras ignored\n",
                  local_98.zFile,(ulong)local_c0 & 0xffffffff,(ulong)uVar5,(ulong)uVar11);
        }
        if ((int)uVar5 <= (int)uVar11) {
          duckdb_shell_sqlite3_step(pStmt);
          iVar3 = duckdb_shell_sqlite3_reset(pStmt);
          pcVar12 = local_98.zFile;
          pFVar13 = _stderr;
          if (iVar3 == 0) {
            local_98.nRow = local_98.nRow + 1;
          }
          else {
            duckdb_shell_sqlite3_errmsg(local_b0->db);
            fprintf(pFVar13,"%s:%d: INSERT failed: %s\n",pcVar12);
            local_98.nErr = local_98.nErr + 1;
          }
        }
        if (local_98.cTerm == 0xffffffff) {
          import_cleanup(&local_98);
          duckdb_shell_sqlite3_finalize(pStmt);
          pSVar15 = local_b0;
          if ((int)local_a0 != 0) {
            duckdb_shell_sqlite3_exec
                      (local_b0->db,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
          }
          if (0 < local_b4) {
            fprintf((FILE *)pSVar15->out,"Added %d rows with %d errors using %d lines of input\n",
                    (ulong)local_98._40_8_ >> 0x20,local_98._48_8_ & 0xffffffff,
                    (ulong)(local_98.nLine - 1));
            return true;
          }
          return true;
        }
      } while( true );
    }
    ShellDatabaseError(pSVar15,pSVar15->db);
    if (pStmt != (sqlite3_stmt *)0x0) {
      duckdb_shell_sqlite3_finalize(pStmt);
    }
  }
  else {
    pcVar16 = duckdb_shell_sqlite3_errmsg(pSVar15->db);
    iVar3 = duckdb_shell_sqlite3_strglob("Catalog Error: Table with name *",pcVar16);
    if (iVar3 == 0) {
      local_a8 = pcVar12;
      local_a0 = sVar7;
      pcVar12 = duckdb_shell_sqlite3_mprintf("CREATE TABLE %s",local_c0);
      uVar10 = 0x28;
      bVar2 = true;
      do {
        lVar6 = (*pcVar14)(&local_98);
        if (lVar6 == 0) {
          if (bVar2) {
            duckdb_shell_sqlite3_free(pcVar12);
            import_cleanup(&local_98);
            pcVar16 = "%s: empty file\n";
            pcVar12 = local_98.zFile;
            goto LAB_001e490e;
          }
          break;
        }
        bVar2 = false;
        pcVar12 = duckdb_shell_sqlite3_mprintf("%z%c\n  \"%w\" TEXT",pcVar12,uVar10);
        uVar10 = 0x2c;
      } while (local_98.cTerm == local_98.cColSep);
      pcVar12 = duckdb_shell_sqlite3_mprintf("%z\n)",pcVar12);
      pSVar15 = local_b0;
      if (0 < local_b4) {
        fprintf((FILE *)local_b0->out,"%s\n",pcVar12);
      }
      iVar3 = duckdb_shell_sqlite3_exec
                        (pSVar15->db,pcVar12,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      duckdb_shell_sqlite3_free(pcVar12);
      sVar7 = local_a0;
      pcVar12 = local_a8;
      pFVar13 = _stderr;
      if (iVar3 != 0) {
        pcVar12 = duckdb_shell_sqlite3_errmsg(pSVar15->db);
        fprintf(pFVar13,"CREATE TABLE %s(...) failed: %s\n",local_c0,pcVar12);
        import_cleanup(&local_98);
        return false;
      }
      iVar3 = duckdb_shell_sqlite3_prepare_v2(pSVar15->db,local_a8,-1,&pStmt,(char **)0x0);
      duckdb_shell_sqlite3_free(pcVar12);
      if (iVar3 == 0) goto LAB_001e4475;
    }
    else {
      duckdb_shell_sqlite3_free(pcVar12);
    }
    if (pStmt != (sqlite3_stmt *)0x0) {
      duckdb_shell_sqlite3_finalize(pStmt);
    }
    ShellDatabaseError(pSVar15,pSVar15->db);
  }
  import_cleanup(&local_98);
  return false;
}

Assistant:

bool ShellState::ImportData(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".import cannot be used in -safe mode\n");
		return false;
	}
	int rc;
	const char *zTable = nullptr;              /* Insert data into this table */
	const char *zFile = nullptr;               /* Name of file to extra content from */
	sqlite3_stmt *pStmt = nullptr;             /* A statement */
	int nCol;                                  /* Number of columns in the table */
	int nByte;                                 /* Number of bytes in an SQL string */
	int j;                                     /* Loop counters */
	int needCommit;                            /* True to COMMIT or ROLLBACK at end */
	char *zSql;                                /* An SQL statement */
	ImportCtx sCtx;                            /* Reader context */
	char *(SQLITE_CDECL * xRead)(ImportCtx *); /* Func to read one value */
	int eVerbose = 0;                          /* Larger for more console output */
	int nSkip = 0;                             /* Initial lines to skip */
	int useOutputMode = 1;                     /* Use output mode to determine separators */

	memset(&sCtx, 0, sizeof(sCtx));
	if (mode == RenderMode::ASCII) {
		xRead = ascii_read_one_field;
	} else {
		xRead = csv_read_one_field;
	}
	for (idx_t i = 1; i < nArg; i++) {
		auto z = azArg[i];
		if (z[0] == '-' && z[1] == '-')
			z++;
		if (z[0] != '-') {
			if (zFile == 0) {
				zFile = z;
			} else if (zTable == 0) {
				zTable = z;
			} else {
				utf8_printf(out, "ERROR: extra argument: \"%s\".  Usage:\n", z);
				showHelp(out, "import");
				return false;
			}
		} else if (strcmp(z, "-v") == 0) {
			eVerbose++;
		} else if (strcmp(z, "-skip") == 0 && i < nArg - 1) {
			nSkip = (int)integerValue(azArg[++i]);
		} else if (strcmp(z, "-ascii") == 0) {
			sCtx.cColSep = SEP_Unit[0];
			sCtx.cRowSep = SEP_Record[0];
			xRead = ascii_read_one_field;
			useOutputMode = 0;
		} else if (strcmp(z, "-csv") == 0) {
			sCtx.cColSep = ',';
			sCtx.cRowSep = '\n';
			xRead = csv_read_one_field;
			useOutputMode = 0;
		} else {
			utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", z);
			showHelp(out, "import");
			return false;
		}
	}
	if (zTable == 0) {
		utf8_printf(out, "ERROR: missing %s argument. Usage:\n", zFile == 0 ? "FILE" : "TABLE");
		showHelp(out, "import");
		return false;
	}
	seenInterrupt = 0;
	OpenDB(0);
	if (useOutputMode) {
		/* If neither the --csv or --ascii options are specified, then set
		** the column and row separator characters from the output mode. */
		int nSep = colSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null column separator required for import\n");
			return false;
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character column separators not allowed"
			                   " for import\n");
			return false;
		}
		nSep = rowSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null row separator required for import\n");
			return false;
		}
		if (nSep == 2 && mode == RenderMode::CSV && rowSeparator == SEP_CrLf) {
			/* When importing CSV (only), if the row separator is set to the
			** default output row separator, change it to the default input
			** row separator.  This avoids having to maintain different input
			** and output row separators. */
			rowSeparator = SEP_Row;
			nSep = rowSeparator.size();
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character row separators not allowed"
			                   " for import\n");
			return false;
		}
		sCtx.cColSep = colSeparator[0];
		sCtx.cRowSep = rowSeparator[0];
	}
	sCtx.zFile = zFile;
	sCtx.nLine = 1;
	if (sCtx.zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		rc = 1;
		goto meta_command_exit;
#else
		sCtx.in = popen(sCtx.zFile + 1, "r");
		sCtx.zFile = "<pipe>";
		sCtx.xCloser = pclose;
#endif
	} else {
		sCtx.in = fopen(sCtx.zFile, "rb");
		sCtx.xCloser = fclose;
	}
	if (sCtx.in == 0) {
		utf8_printf(stderr, "Error: cannot open \"%s\"\n", zFile);
		return false;
	}
	if (eVerbose >= 2 || (eVerbose >= 1 && useOutputMode)) {
		char zSep[2];
		zSep[1] = 0;
		zSep[0] = sCtx.cColSep;
		utf8_printf(out, "Column separator ");
		OutputCString(zSep);
		utf8_printf(out, ", row separator ");
		zSep[0] = sCtx.cRowSep;
		OutputCString(zSep);
		utf8_printf(out, "\n");
	}
	while ((nSkip--) > 0) {
		while (xRead(&sCtx) && sCtx.cTerm == sCtx.cColSep) {
		}
	}
	zSql = sqlite3_mprintf("SELECT * FROM %s", zTable);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	nByte = StringLength(zSql);
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	import_append_char(&sCtx, 0); /* To ensure sCtx.z is allocated */
	if (rc && sqlite3_strglob("Catalog Error: Table with name *", sqlite3_errmsg(db)) == 0) {
		char *zCreate = sqlite3_mprintf("CREATE TABLE %s", zTable);
		char cSep = '(';
		while (xRead(&sCtx)) {
			zCreate = sqlite3_mprintf("%z%c\n  \"%w\" TEXT", zCreate, cSep, sCtx.z);
			cSep = ',';
			if (sCtx.cTerm != sCtx.cColSep)
				break;
		}
		if (cSep == '(') {
			sqlite3_free(zCreate);
			import_cleanup(&sCtx);
			utf8_printf(stderr, "%s: empty file\n", sCtx.zFile);
			return false;
		}
		zCreate = sqlite3_mprintf("%z\n)", zCreate);
		if (eVerbose >= 1) {
			utf8_printf(out, "%s\n", zCreate);
		}
		rc = sqlite3_exec(db, zCreate, 0, 0, 0);
		sqlite3_free(zCreate);
		if (rc) {
			utf8_printf(stderr, "CREATE TABLE %s(...) failed: %s\n", zTable, sqlite3_errmsg(db));
			import_cleanup(&sCtx);
			return false;
		}
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	if (rc) {
		if (pStmt)
			sqlite3_finalize(pStmt);
		ShellDatabaseError(db);
		import_cleanup(&sCtx);
		return false;
	}
	nCol = sqlite3_column_count(pStmt);
	sqlite3_finalize(pStmt);
	pStmt = 0;
	if (nCol == 0)
		return 0; /* no columns, no error */
	zSql = (char *)sqlite3_malloc64(nByte * 2 + 20 + nCol * 2);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	sqlite3_snprintf(nByte + 20, zSql, "INSERT INTO \"%w\" VALUES(?", zTable);
	j = StringLength(zSql);
	for (int i = 1; i < nCol; i++) {
		zSql[j++] = ',';
		zSql[j++] = '?';
	}
	zSql[j++] = ')';
	zSql[j] = 0;
	if (eVerbose >= 2) {
		utf8_printf(out, "Insert using: %s\n", zSql);
	}
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	sqlite3_free(zSql);
	if (rc) {
		ShellDatabaseError(db);
		if (pStmt)
			sqlite3_finalize(pStmt);
		import_cleanup(&sCtx);
		return false;
	}
	needCommit = sqlite3_get_autocommit(db);
	if (needCommit)
		sqlite3_exec(db, "BEGIN", 0, 0, 0);
	do {
		int startLine = sCtx.nLine;
		int i;
		for (i = 0; i < nCol; i++) {
			char *z = xRead(&sCtx);
			/*
			** Did we reach end-of-file before finding any columns?
			** If so, stop instead of NULL filling the remaining columns.
			*/
			if (z == 0 && i == 0)
				break;
			/*
			** Did we reach end-of-file OR end-of-line before finding any
			** columns in ASCII mode?  If so, stop instead of NULL filling
			** the remaining columns.
			*/
			if (mode == RenderMode::ASCII && (z == 0 || z[0] == 0) && i == 0)
				break;
			sqlite3_bind_text(pStmt, i + 1, z, -1, SQLITE_TRANSIENT);
			if (i < nCol - 1 && sCtx.cTerm != sCtx.cColSep) {
				utf8_printf(stderr,
				            "%s:%d: expected %d columns but found %d - "
				            "filling the rest with NULL\n",
				            sCtx.zFile, startLine, nCol, i + 1);
				i += 2;
				while (i <= nCol) {
					sqlite3_bind_null(pStmt, i);
					i++;
				}
			}
		}
		if (sCtx.cTerm == sCtx.cColSep) {
			do {
				xRead(&sCtx);
				i++;
			} while (sCtx.cTerm == sCtx.cColSep);
			utf8_printf(stderr,
			            "%s:%d: expected %d columns but found %d - "
			            "extras ignored\n",
			            sCtx.zFile, startLine, nCol, i);
		}
		if (i >= nCol) {
			sqlite3_step(pStmt);
			rc = sqlite3_reset(pStmt);
			if (rc != SQLITE_OK) {
				utf8_printf(stderr, "%s:%d: INSERT failed: %s\n", sCtx.zFile, startLine, sqlite3_errmsg(db));
				sCtx.nErr++;
			} else {
				sCtx.nRow++;
			}
		}
	} while (sCtx.cTerm != EOF);

	import_cleanup(&sCtx);
	sqlite3_finalize(pStmt);
	if (needCommit)
		sqlite3_exec(db, "COMMIT", 0, 0, 0);
	if (eVerbose > 0) {
		utf8_printf(out, "Added %d rows with %d errors using %d lines of input\n", sCtx.nRow, sCtx.nErr,
		            sCtx.nLine - 1);
	}
	return true;
}